

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_jsr_32_al(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar2 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar2);
  }
  uVar1 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  uVar2 = m68ki_cpu.pc;
  addr_in = m68ki_cpu.dar[0xf] - 4;
  m68ki_cpu.dar[0xf] = addr_in;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_32(addr_in & m68ki_cpu.address_mask,uVar2);
  m68ki_cpu.pc = uVar1;
  return;
}

Assistant:

static void m68k_op_jsr_32_al(void)
{
	uint ea = EA_AL_32();
	m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
	m68ki_push_32(REG_PC);
	m68ki_jump(ea);
}